

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O2

void __thiscall minihttp::Request::Request(Request *this,string *h,string *res,int p,void *u)

{
  (this->protocol)._M_dataplus._M_p = (pointer)&(this->protocol).field_2;
  (this->protocol)._M_string_length = 0;
  (this->protocol).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->host,(string *)h);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  (this->header)._M_string_length = 0;
  (this->header).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->resource,(string *)res);
  (this->extraGetHeaders)._M_dataplus._M_p = (pointer)&(this->extraGetHeaders).field_2;
  (this->extraGetHeaders)._M_string_length = 0;
  (this->extraGetHeaders).field_2._M_local_buf[0] = '\0';
  this->port = 0x50;
  this->user = u;
  this->useSSL = false;
  (this->post).data._M_dataplus._M_p = (pointer)&(this->post).data.field_2;
  (this->post).data._M_string_length = 0;
  (this->post).data.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Request(const std::string& h, const std::string& res, int p = 80, void *u = NULL)
        : host(h), resource(res), port(80), user(u), useSSL(false) {}